

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall
c4::basic_substring<const_char>::begins_with(basic_substring<const_char> *this,char c,size_t num)

{
  size_t i;
  size_t num_local;
  char c_local;
  basic_substring<const_char> *this_local;
  bool local_1;
  
  if (this->len < num) {
    local_1 = false;
  }
  else {
    for (i = 0; i < num; i = i + 1) {
      if (this->str[i] != c) {
        return false;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool begins_with(const C c, size_t num) const
    {
        if(len < num)
        {
            return false;
        }
        for(size_t i = 0; i < num; ++i)
        {
            if(str[i] != c)
            {
                return false;
            }
        }
        return true;
    }